

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParserAdams.cpp
# Opt level: O3

void chrono::utils::parseADMMarker
               (string *ID,
               vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *tokens,ChSystem *sys)

{
  size_t sVar1;
  long *plVar2;
  pointer ppVar3;
  pointer ppVar4;
  int iVar5;
  int iVar6;
  mapped_type *pmVar7;
  int *piVar8;
  pointer ppVar9;
  undefined8 uVar10;
  long lVar11;
  bool bVar12;
  double dVar13;
  long *local_58;
  size_t local_50;
  long local_48 [2];
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chrono::utils::adams_marker_struct>_>_>
                         *)markers_map_abi_cxx11_,ID);
  ppVar9 = (tokens->
           super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_38 = tokens;
  if (ppVar9 != (tokens->
                super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (ppVar9->first == 1) {
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"PART","");
        plVar2 = local_58;
        sVar1 = (ppVar9->second)._M_string_length;
        if (sVar1 == local_50) {
          if (sVar1 == 0) {
            bVar12 = true;
          }
          else {
            iVar5 = bcmp((ppVar9->second)._M_dataplus._M_p,local_58,sVar1);
            bVar12 = iVar5 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (plVar2 != local_48) {
          operator_delete(plVar2,local_48[0] + 1);
        }
        if (bVar12) {
          ppVar9 = ppVar9 + 1;
          std::__cxx11::string::_M_assign((string *)pmVar7);
        }
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"QP","");
        plVar2 = local_58;
        sVar1 = (ppVar9->second)._M_string_length;
        if (sVar1 == local_50) {
          if (sVar1 == 0) {
            bVar12 = true;
          }
          else {
            iVar5 = bcmp((ppVar9->second)._M_dataplus._M_p,local_58,sVar1);
            bVar12 = iVar5 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (plVar2 != local_48) {
          operator_delete(plVar2,local_48[0] + 1);
        }
        if (bVar12) {
          piVar8 = __errno_location();
          lVar11 = 0;
          iVar5 = *piVar8;
          do {
            plVar2 = (long *)ppVar9[1].second._M_dataplus._M_p;
            *piVar8 = 0;
            dVar13 = strtod((char *)plVar2,(char **)&local_58);
            if (local_58 == plVar2) {
              std::__throw_invalid_argument("stod");
              goto LAB_0093ab12;
            }
            iVar6 = *piVar8;
            if (iVar6 == 0) {
              *piVar8 = iVar5;
              iVar6 = iVar5;
            }
            else if (iVar6 == 0x22) goto LAB_0093ab1e;
            pmVar7->loc[lVar11] = dVar13;
            ppVar9 = ppVar9 + 1;
            lVar11 = lVar11 + 1;
            iVar5 = iVar6;
          } while (lVar11 != 3);
        }
        local_58 = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"REULER","");
        plVar2 = local_58;
        sVar1 = (ppVar9->second)._M_string_length;
        if (sVar1 == local_50) {
          if (sVar1 == 0) {
            bVar12 = true;
          }
          else {
            iVar5 = bcmp((ppVar9->second)._M_dataplus._M_p,local_58,sVar1);
            bVar12 = iVar5 == 0;
          }
        }
        else {
          bVar12 = false;
        }
        if (plVar2 != local_48) {
          operator_delete(plVar2,local_48[0] + 1);
        }
        if (bVar12) {
          piVar8 = __errno_location();
          lVar11 = 0;
          iVar5 = *piVar8;
          do {
            plVar2 = (long *)ppVar9[1].second._M_dataplus._M_p;
            *piVar8 = 0;
            dVar13 = strtod((char *)plVar2,(char **)&local_58);
            if (local_58 == plVar2) {
LAB_0093ab12:
              std::__throw_invalid_argument("stod");
LAB_0093ab1e:
              std::__throw_out_of_range("stod");
LAB_0093ab2a:
              uVar10 = std::__throw_out_of_range("stod");
              if (*piVar8 == 0) {
                *piVar8 = iVar5;
              }
              _Unwind_Resume(uVar10);
            }
            iVar6 = *piVar8;
            if (iVar6 == 0) {
              *piVar8 = iVar5;
              iVar6 = iVar5;
            }
            else if (iVar6 == 0x22) goto LAB_0093ab2a;
            ppVar3 = ppVar9 + 1;
            ppVar4 = ppVar9 + 1;
            ppVar9 = ppVar9 + 1;
            bVar12 = (ppVar3->second)._M_dataplus._M_p[(ppVar4->second)._M_string_length - 1] == 'D'
            ;
            pmVar7->rot[lVar11] =
                 (double)((ulong)bVar12 * (long)(dVar13 * 0.017453292519943295) +
                         (ulong)!bVar12 * (long)dVar13);
            lVar11 = lVar11 + 1;
            iVar5 = iVar6;
          } while (lVar11 != 3);
        }
      }
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != (local_38->
                       super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void parseADMMarker(std::string ID, std::vector<std::pair<int, std::string>>& tokens, ChSystem& sys) {
    adams_marker_struct& marker = markers_map[ID];  // uses default contructor
    auto iter = tokens.begin();
    while (iter != tokens.end()) {
        // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;
        if (iter->first == LABEL) {
            if (iter->second == std::string("PART")) {
                iter++;
                marker.part_id = iter->second;
            }
            if (iter->second == std::string("QP")) {
                // std::cout << "reading loc " <<std::endl;

                for (int i = 0; i < 3; i++) {
                    iter++;
                    // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;

                    marker.loc[i] = std::stod(iter->second);
                }
            }
            if (iter->second == std::string("REULER")) {
                // std::cout << "reading rot " <<std::endl;
                for (int i = 0; i < 3; i++) {
                    iter++;
                    // std::cout << "token is " << iter->first << ", " << iter->second <<std::endl;
                    double val = std::stod(iter->second);

                    if (iter->second.back() == 'D') {
                        // This is a decimal and we need to convert to radians
                        val *= CH_C_DEG_TO_RAD;
                    }
                    // std::cout << "val is " << val <<std::endl;
                    marker.rot[i] = val;
                }
            }
        }

        iter++;
    }
}